

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

bool cmVariableWatchCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *this;
  _func_int **pp_Var2;
  bool bVar3;
  undefined1 *client_data;
  cmake *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __allocator_type __a2;
  _Manager_type *local_120;
  _func_int **local_118;
  char local_110;
  uint7 uStack_10f;
  _func_int **pp_Stack_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_f0 [16];
  _Manager_type local_e0;
  _func_int **pp_Stack_d8;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  string local_70;
  string command;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"must be called with at least one argument.",
               (allocator<char> *)local_a8._M_pod_data);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)local_f0);
    return false;
  }
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  if (0x20 < (ulong)((long)pbVar1 - (long)__lhs)) {
    std::__cxx11::string::_M_assign((string *)&command);
  }
  bVar3 = std::operator==(__lhs,"CMAKE_CURRENT_LIST_FILE");
  if (bVar3) {
    local_f0._0_8_ = (_Manager_type *)0x1f;
    local_f0._8_8_ = "cannot be set on the variable: ";
    local_a8._8_8_ = (__lhs->_M_dataplus)._M_p;
    local_a8._M_unused._0_8_ = (undefined8)__lhs->_M_string_length;
    cmStrCat<>(&local_70,(cmAlphaNum *)local_f0,(cmAlphaNum *)&local_a8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    client_data = (undefined1 *)operator_new(0x28);
    *(undefined1 **)(client_data + 8) = client_data + 0x18;
    *(undefined8 *)(client_data + 0x10) = 0;
    client_data[0x18] = 0;
    *client_data = 0;
    std::__cxx11::string::operator=((string *)(client_data + 8),(string *)&command);
    pcVar4 = cmMakefile::GetCMakeInstance(status->Makefile);
    bVar3 = cmVariableWatch::AddWatch
                      ((pcVar4->VariableWatch)._M_t.
                       super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>
                       .super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,__lhs,
                       anon_unknown.dwarf_109f001::cmVariableWatchCommandVariableAccessed,
                       client_data,anon_unknown.dwarf_109f001::deleteVariableWatchCallbackData);
    if (bVar3) {
      this = status->Makefile;
      std::__cxx11::string::string((string *)&local_120,(string *)__lhs);
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
      pp_Var2 = local_118;
      local_a8._M_unused._M_object = &__a2;
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00854ee8;
      local_f0._0_8_ = &local_e0;
      if (local_120 == (_Manager_type *)&local_110) {
        pp_Stack_d8 = pp_Stack_108;
        local_120 = (_Manager_type *)local_f0._0_8_;
      }
      local_e0 = (_Manager_type)CONCAT71(uStack_10f,local_110);
      local_118 = (_func_int **)0x0;
      local_110 = '\0';
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)this;
      *(_Atomic_word **)&p_Var5[1]._M_use_count = &p_Var5[2]._M_use_count;
      if (local_120 == (_Manager_type *)local_f0._0_8_) {
        *(_Manager_type *)&p_Var5[2]._M_use_count = local_e0;
        p_Var5[3]._vptr__Sp_counted_base = pp_Stack_d8;
      }
      else {
        *(_Manager_type **)&p_Var5[1]._M_use_count = local_120;
        *(_Manager_type *)&p_Var5[2]._M_use_count = local_e0;
      }
      p_Var5[2]._vptr__Sp_counted_base = pp_Var2;
      local_f0._8_8_ = (char *)0x0;
      local_e0 = (_Manager_type)((ulong)uStack_10f << 8);
      local_120 = (_Manager_type *)&local_110;
      std::__cxx11::string::~string((string *)local_f0);
      local_a8._8_8_ = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::FinalAction::Impl,_std::allocator<(anonymous_namespace)::FinalAction::Impl>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::FinalAction::Impl,_std::allocator<(anonymous_namespace)::FinalAction::Impl>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_a8);
      local_70._M_dataplus._M_p = (pointer)0x0;
      local_70._M_string_length = 0;
      local_100 = p_Var5 + 1;
      local_f8._M_pi = p_Var5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
      local_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = (pointer)0x0;
      local_a8._M_unused._M_object = operator_new(0x10);
      local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._M_unused._0_8_ = p_Var5 + 1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a8._M_unused._0_8_ + 8) =
           p_Var5;
      pcStack_90 = std::
                   _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(anonymous_namespace)::FinalAction>
                   ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(anonymous_namespace)::FinalAction>
                 ::_M_manager;
      cmMakefile::GeneratorAction::GeneratorAction((GeneratorAction *)local_f0,(ActionT *)&local_a8)
      ;
      cmMakefile::AddGeneratorAction(this,(GeneratorAction *)local_f0);
      cmMakefile::GeneratorAction::~GeneratorAction((GeneratorAction *)local_f0);
      std::_Function_base::~_Function_base((_Function_base *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
      std::__cxx11::string::~string((string *)&local_120);
      bVar3 = true;
      goto LAB_00333f72;
    }
    anon_unknown.dwarf_109f001::deleteVariableWatchCallbackData(client_data);
  }
  bVar3 = false;
LAB_00333f72:
  std::__cxx11::string::~string((string *)&command);
  return bVar3;
}

Assistant:

bool cmVariableWatchCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }
  std::string const& variable = args[0];
  std::string command;
  if (args.size() > 1) {
    command = args[1];
  }
  if (variable == "CMAKE_CURRENT_LIST_FILE") {
    status.SetError(cmStrCat("cannot be set on the variable: ", variable));
    return false;
  }

  auto* const data = new cmVariableWatchCallbackData;

  data->InCallback = false;
  data->Command = std::move(command);

  if (!status.GetMakefile().GetCMakeInstance()->GetVariableWatch()->AddWatch(
        variable, cmVariableWatchCommandVariableAccessed, data,
        deleteVariableWatchCallbackData)) {
    deleteVariableWatchCallbackData(data);
    return false;
  }

  status.GetMakefile().AddGeneratorAction(
    FinalAction{ &status.GetMakefile(), variable });
  return true;
}